

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O3

void ym2612_set_mute_mask(void *chip,UINT32 MuteMask)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  long lVar5;
  
  auVar1 = _DAT_001769f0;
  lVar2 = (long)chip + 0x4908;
  lVar3 = 0;
  auVar4 = _DAT_001769e0;
  do {
    if (SUB164(auVar4 ^ auVar1,4) == -0x80000000 && SUB164(auVar4 ^ auVar1,0) < -0x7ffffffa) {
      *(bool *)lVar2 = (MuteMask >> ((uint)lVar3 & 0x1f) & 1) != 0;
      *(bool *)(lVar2 + 0x198) = (MuteMask >> ((uint)lVar3 + 1 & 0x1f) & 1) != 0;
    }
    lVar3 = lVar3 + 2;
    lVar5 = auVar4._8_8_;
    auVar4._0_8_ = auVar4._0_8_ + 2;
    auVar4._8_8_ = lVar5 + 2;
    lVar2 = lVar2 + 0x330;
  } while (lVar3 != 6);
  *(byte *)((long)chip + 0x5110) = (byte)(MuteMask >> 6) & 1;
  return;
}

Assistant:

void ym2612_set_mute_mask(void *chip, UINT32 MuteMask)
{
	YM2612 *F2612 = (YM2612 *)chip;
	UINT8 CurChn;
	
	for (CurChn = 0; CurChn < 6; CurChn ++)
		F2612->CH[CurChn].Muted = (MuteMask >> CurChn) & 0x01;
	F2612->MuteDAC = (MuteMask >> 6) & 0x01;
	
	return;
}